

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O2

Gia_Man_t * Gia_ManOneHot(int nSkips,int nVars)

{
  int nObjsMax;
  int iLit1;
  int iLit0;
  int iVar1;
  int iVar2;
  uint uVar3;
  int *__ptr;
  Gia_Man_t *p;
  char *pcVar4;
  int iVar5;
  ulong uVar6;
  size_t __nmemb;
  long lVar7;
  bool bVar8;
  
  iVar2 = nVars;
  if (1 < (uint)nVars) {
    iVar2 = 0;
    for (uVar3 = nVars - 1; uVar3 != 0; uVar3 = uVar3 >> 1) {
      iVar2 = iVar2 + 1;
    }
  }
  __nmemb = (size_t)(1 << ((byte)iVar2 & 0x1f));
  __ptr = (int *)calloc(__nmemb,4);
  nObjsMax = nSkips + 1 + nVars * 4;
  p = Gia_ManStart(nObjsMax);
  pcVar4 = Abc_UtilStrsav("onehot");
  p->pName = pcVar4;
  iVar5 = 0;
  if (0 < nSkips) {
    iVar5 = nSkips;
  }
  while (bVar8 = iVar5 != 0, iVar5 = iVar5 + -1, bVar8) {
    Gia_ManAppendCi(p);
  }
  uVar6 = 0;
  if (nVars < 1) {
    nVars = 0;
  }
  for (; (uint)nVars != uVar6; uVar6 = uVar6 + 1) {
    iVar5 = Gia_ManAppendCi(p);
    __ptr[uVar6] = iVar5;
  }
  Gia_ManHashStart(p);
  for (iVar5 = 0; iVar5 != iVar2; iVar5 = iVar5 + 1) {
    for (lVar7 = 0; lVar7 < (long)__nmemb; lVar7 = lVar7 + (2 << ((byte)iVar5 & 0x1f))) {
      iVar1 = __ptr[lVar7];
      iLit1 = __ptr[(1 << ((byte)iVar5 & 0x1f)) + lVar7];
      iLit0 = Gia_ManHashAnd(p,iVar1,iLit1);
      if (iLit0 != 0) {
        Gia_ManAppendCo(p,iLit0);
      }
      iVar1 = Gia_ManHashOr(p,iVar1,iLit1);
      __ptr[lVar7] = iVar1;
    }
  }
  Gia_ManHashStop(p);
  iVar2 = Abc_LitNot(*__ptr);
  Gia_ManAppendCo(p,iVar2);
  free(__ptr);
  if (p->nObjs <= nObjsMax) {
    return p;
  }
  __assert_fail("Gia_ManObjNum(p) <= nSkips + 4 * nVars + 1",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaDup.c"
                ,0xe47,"Gia_Man_t *Gia_ManOneHot(int, int)");
}

Assistant:

Gia_Man_t * Gia_ManOneHot( int nSkips, int nVars )
{
    Gia_Man_t * p;
    int i, b, Shift, iGiaLit, nLogVars = Abc_Base2Log( nVars );
    int * pTemp = ABC_CALLOC( int, (1 << nLogVars) );
    p = Gia_ManStart( nSkips + 4 * nVars + 1 );
    p->pName = Abc_UtilStrsav( "onehot" );
    for ( i = 0; i < nSkips; i++ )
        Gia_ManAppendCi( p );
    for ( i = 0; i < nVars; i++ )
        pTemp[i] = Gia_ManAppendCi( p );
    Gia_ManHashStart( p );
    for ( b = 0; b < nLogVars; b++ )
        for ( i = 0, Shift = (1<<b); i < (1 << nLogVars); i += 2*Shift )
        {
            iGiaLit = Gia_ManHashAnd( p, pTemp[i], pTemp[i + Shift] );
            if ( iGiaLit )
                Gia_ManAppendCo( p, iGiaLit );
            pTemp[i] = Gia_ManHashOr( p, pTemp[i], pTemp[i + Shift] );
        }
    Gia_ManHashStop( p );
    Gia_ManAppendCo( p, Abc_LitNot(pTemp[0]) );
    ABC_FREE( pTemp );
    assert( Gia_ManObjNum(p) <= nSkips + 4 * nVars + 1 );
    return p;
}